

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

MemberSyntax * __thiscall
slang::parsing::Parser::parseVariableDeclaration(Parser *this,AttrList attributes)

{
  Token semi_00;
  bool bVar1;
  TokenKind TVar2;
  ForwardTypeRestrictionSyntax *typeRestriction;
  ForwardTypedefDeclarationSyntax *pFVar3;
  ParameterDeclarationBaseSyntax *parameter;
  ParameterDeclarationStatementSyntax *pPVar4;
  PackageImportDeclarationSyntax *pPVar5;
  NetTypeDeclarationSyntax *pNVar6;
  DataDeclarationSyntax *pDVar7;
  AssertionItemPortListSyntax *portList;
  ExpressionSyntax *expr;
  LetDeclarationSyntax *pLVar8;
  DataTypeSyntax *type;
  TypedefDeclarationSyntax *pTVar9;
  __extent_storage<18446744073709551615UL> _Var10;
  pointer ppAVar11;
  Token TVar12;
  Token TVar13;
  Token TVar14;
  Token semi_01;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_a0;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_68;
  
  _Var10 = attributes._M_extent._M_extent_value;
  ppAVar11 = attributes._M_ptr;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar12.kind;
  local_a0.super_SyntaxListBase.childCount = _Var10._M_extent_value;
  local_a0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       ppAVar11;
  local_a0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = _Var10._M_extent_value;
  if (TVar2 < NetTypeKeyword) {
    if (TVar2 == ImportKeyword) {
      pPVar5 = parseImportDeclaration(this,attributes);
      return &pPVar5->super_MemberSyntax;
    }
    if (TVar2 == LetKeyword) {
      TVar12 = ParserBase::consume(&this->super_ParserBase);
      TVar13 = ParserBase::expect(&this->super_ParserBase,Identifier);
      portList = parseAssertionItemPortList(this,LetDeclaration);
      TVar14 = ParserBase::expect(&this->super_ParserBase,Equals);
      expr = parseExpression(this);
      local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623138;
      semi_01 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      pLVar8 = slang::syntax::SyntaxFactory::letDeclaration
                         (&this->factory,&local_a0,TVar12,TVar13,portList,TVar14,expr,semi_01);
      return &pLVar8->super_MemberSyntax;
    }
    if (TVar2 != LocalParamKeyword) {
LAB_001d06ea:
      pDVar7 = parseDataDeclaration(this,attributes);
      return &pDVar7->super_MemberSyntax;
    }
  }
  else {
    if (TVar2 == NetTypeKeyword) {
      pNVar6 = parseNetTypeDecl(this,attributes);
      return &pNVar6->super_MemberSyntax;
    }
    if (TVar2 != ParameterKeyword) {
      if (TVar2 == TypedefKeyword) {
        TVar12 = ParserBase::consume(&this->super_ParserBase);
        typeRestriction = parseTypeRestriction(this,false);
        if ((typeRestriction == (ForwardTypeRestrictionSyntax *)0x0) &&
           ((bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier), !bVar1 ||
            (TVar13 = ParserBase::peek(&this->super_ParserBase,1), TVar13.kind != Semicolon)))) {
          type = parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x0);
          TVar13 = ParserBase::expect(&this->super_ParserBase,Identifier);
          local_68.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> =
               parseDimensionList(this);
          local_68.super_SyntaxListBase.childCount =
               (size_t)local_68.
                       super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                       _M_extent._M_extent_value;
          local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
          local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623138;
          local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
          local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006230b0;
          TVar14 = ParserBase::expect(&this->super_ParserBase,Semicolon);
          pTVar9 = slang::syntax::SyntaxFactory::typedefDeclaration
                             (&this->factory,&local_a0,TVar12,type,TVar13,&local_68,TVar14);
          return &pTVar9->super_MemberSyntax;
        }
        TVar13 = ParserBase::expect(&this->super_ParserBase,Identifier);
        local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
        local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623138;
        TVar14 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        pFVar3 = slang::syntax::SyntaxFactory::forwardTypedefDeclaration
                           (&this->factory,&local_a0,TVar12,typeRestriction,TVar13,TVar14);
        return &pFVar3->super_MemberSyntax;
      }
      goto LAB_001d06ea;
    }
  }
  Token::Token((Token *)&local_68);
  TVar12 = ParserBase::consume(&this->super_ParserBase);
  parameter = parseParameterDecl(this,TVar12,(Token *)&local_68);
  local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623138;
  semi_00.info._0_4_ = local_68.super_SyntaxListBase.super_SyntaxNode.kind;
  semi_00._0_8_ = local_68.super_SyntaxListBase._vptr_SyntaxListBase;
  semi_00.info._4_4_ = local_68.super_SyntaxListBase.super_SyntaxNode._4_4_;
  pPVar4 = slang::syntax::SyntaxFactory::parameterDeclarationStatement
                     (&this->factory,&local_a0,parameter,semi_00);
  return &pPVar4->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseVariableDeclaration(AttrList attributes) {
    switch (peek().kind) {
        case TokenKind::TypedefKeyword: {
            auto typedefKeyword = consume();
            auto restriction = parseTypeRestriction(/* isExpected */ false);
            if (restriction ||
                (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Semicolon)) {
                auto name = expect(TokenKind::Identifier);
                return factory.forwardTypedefDeclaration(attributes, typedefKeyword, restriction,
                                                         name, expect(TokenKind::Semicolon));
            }

            auto& type = parseDataType();
            auto name = expect(TokenKind::Identifier);
            auto dims = parseDimensionList();
            return factory.typedefDeclaration(attributes, typedefKeyword, type, name, dims,
                                              expect(TokenKind::Semicolon));
        }
        case TokenKind::ParameterKeyword:
        case TokenKind::LocalParamKeyword: {
            Token semi;
            auto& parameter = parseParameterDecl(consume(), &semi);
            return factory.parameterDeclarationStatement(attributes, parameter, semi);
        }
        case TokenKind::LetKeyword: {
            auto let = consume();
            auto identifier = expect(TokenKind::Identifier);
            auto portList = parseAssertionItemPortList(SyntaxKind::LetDeclaration);
            auto equals = expect(TokenKind::Equals);
            auto& expr = parseExpression();
            return factory.letDeclaration(attributes, let, identifier, portList, equals, expr,
                                          expect(TokenKind::Semicolon));
        }
        case TokenKind::ImportKeyword:
            return parseImportDeclaration(attributes);
        case TokenKind::NetTypeKeyword:
            return parseNetTypeDecl(attributes);
        default:
            return parseDataDeclaration(attributes);
    }
}